

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitset.c
# Opt level: O0

void bitset_shift_right(bitset_t *bitset,size_t s)

{
  ulong uVar1;
  ulong uVar2;
  byte bVar3;
  ulong in_RSI;
  bitset_t *in_RDI;
  size_t i_1;
  size_t i;
  size_t as;
  int inword_shift;
  size_t extra_words;
  long local_38;
  ulong local_30;
  _Bool padwithzeroes;
  
  uVar2 = in_RSI >> 6;
  bVar3 = (byte)in_RSI & 0x3f;
  uVar1 = in_RDI->arraysize;
  padwithzeroes = SUB81(in_RSI >> 0x3e,0);
  if ((in_RSI & 0x3f) == 0) {
    for (local_30 = 0; local_30 < uVar1 - uVar2; local_30 = local_30 + 1) {
      in_RDI->array[local_30] = in_RDI->array[local_30 + uVar2];
    }
    bitset_resize(in_RDI,in_RSI,padwithzeroes);
  }
  else {
    for (local_38 = 0; local_38 + uVar2 + 1 < uVar1; local_38 = local_38 + 1) {
      in_RDI->array[local_38] =
           in_RDI->array[local_38 + uVar2] >> bVar3 |
           in_RDI->array[local_38 + uVar2 + 1] << (0x40 - bVar3 & 0x3f);
    }
    in_RDI->array[(uVar1 - uVar2) + -1] = in_RDI->array[uVar1 - 1] >> bVar3;
    bitset_resize(in_RDI,in_RSI,padwithzeroes);
  }
  return;
}

Assistant:

void bitset_shift_right(bitset_t *bitset, size_t s) {
  size_t extra_words = s / 64;
  int inword_shift = s % 64;
  size_t as = bitset->arraysize;
  if(inword_shift == 0) {
    // could be done with a memmove
    for(size_t i = 0 ; i < as - extra_words; i++) {
      bitset->array[i] = bitset->array[i + extra_words];
    }
    bitset_resize(bitset,as - extra_words, false);

  } else {
    for(size_t i = 0 ; i + extra_words + 1 < as ; i++) {
      bitset->array[i] = (bitset->array[i + extra_words] >> inword_shift)
      | (bitset->array[i + extra_words + 1] << (64 - inword_shift));
    }
    bitset->array[as - extra_words - 1] = (bitset->array[as - 1] >> inword_shift);
    bitset_resize(bitset,as - extra_words , false);
  }
}